

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O2

void IOcontroller::write_result(string *outFileName,TResult *resultObj,string *outFolder)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  char cVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream outFileNew;
  
  dVar1 = resultObj->__Approx;
  dVar2 = resultObj->__RunningTime;
  dVar3 = resultObj->__Influence;
  dVar4 = resultObj->__InfluenceOriginal;
  iVar7 = resultObj->__SeedSize;
  dVar5 = resultObj->__BoundMin_inf;
  dVar6 = resultObj->__BoundMin_inf_cost;
  poVar9 = std::operator<<((ostream *)&std::cout,"   --------------------");
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"  |Approx.: ");
  poVar9 = std::ostream::_M_insert<double>(dVar1);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"  |Time (sec): ");
  poVar9 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"  |Influence: ");
  poVar9 = std::ostream::_M_insert<double>(dVar3);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"  |Self-estimated influence: ");
  poVar9 = std::ostream::_M_insert<double>(dVar4);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"  |#Seeds: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"  |#RR sets: ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"  |BoundMin Influence: ");
  poVar9 = std::ostream::_M_insert<double>(dVar5);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"  |BoundMinCost Influence: ");
  poVar9 = std::ostream::_M_insert<double>(dVar6);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"   --------------------");
  std::endl<char,std::char_traits<char>>(poVar9);
  mkdir_absence((outFolder->_M_dataplus)._M_p);
  std::operator+(&local_250,outFolder,"/");
  std::operator+(&local_270,&local_250,outFileName);
  std::ofstream::ofstream(&outFileNew,(string *)&local_270,_S_out);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 != '\0') {
    std::operator<<((ostream *)&outFileNew,"Approx.: ");
    poVar9 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&outFileNew,"Time (sec): ");
    poVar9 = std::ostream::_M_insert<double>(dVar2);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&outFileNew,"Influence: ");
    poVar9 = std::ostream::_M_insert<double>(dVar3);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&outFileNew,"Self-estimated influence: ");
    poVar9 = std::ostream::_M_insert<double>(dVar4);
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&outFileNew,"#Seeds: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&outFileNew,"#RR sets: ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&outFileNew,"BoundMin Influence: ");
    poVar9 = std::ostream::_M_insert<double>(dVar5);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&outFileNew,"BoundMinCost Influence: ");
    poVar9 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&outFileNew);
  return;
}

Assistant:

static void write_result(const std::string& outFileName, const TResult& resultObj, const std::string& outFolder)
    {
        const auto approx = resultObj.get_approximation();
        const auto runTime = resultObj.get_running_time();
        const auto influence = resultObj.get_influence();
        const auto influenceOriginal = resultObj.get_influence_original();
        const auto seedSize = resultObj.get_seed_size();
        const auto RRsetsSize = resultObj.get_RRsets_size();
        const auto Boundmin_influence = resultObj.get_boundmin_inf();
        const auto Boundmin_cost_influence = resultObj.get_boundmin_inf_cost();

        std::cout << "   --------------------" << std::endl;
        std::cout << "  |Approx.: " << approx << std::endl;
        std::cout << "  |Time (sec): " << runTime << std::endl;
        std::cout << "  |Influence: " << influence << std::endl;
        std::cout << "  |Self-estimated influence: " << influenceOriginal << std::endl;
        std::cout << "  |#Seeds: " << seedSize << std::endl;
        std::cout << "  |#RR sets: " << RRsetsSize << std::endl;
        std::cout << "  |BoundMin Influence: " << Boundmin_influence << std::endl;
        std::cout << "  |BoundMinCost Influence: " << Boundmin_cost_influence << std::endl;
        std::cout << "   --------------------" << std::endl;
        mkdir_absence(outFolder.c_str());
        std::ofstream outFileNew(outFolder + "/" + outFileName);
        if (outFileNew.is_open())
        {
            outFileNew << "Approx.: " << approx << std::endl;
            outFileNew << "Time (sec): " << runTime << std::endl;
            outFileNew << "Influence: " << influence << std::endl;
            outFileNew << "Self-estimated influence: " << influenceOriginal << std::endl;
            outFileNew << "#Seeds: " << seedSize << std::endl;
            outFileNew << "#RR sets: " << RRsetsSize << std::endl;
            outFileNew << "BoundMin Influence: " << Boundmin_influence << std::endl;
            outFileNew << "BoundMinCost Influence: " << Boundmin_cost_influence << std::endl;
            outFileNew.close();
        }
    }